

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O1

void voc_iterate(voccxdef *ctx,objnum objn,_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *fn,
                void *fnctx)

{
  vocdef **ppvVar1;
  int iVar2;
  vocdef *pvVar3;
  uint uVar4;
  vocwdef *pvVar5;
  
  ppvVar1 = ctx->voccxhsh;
  iVar2 = 0x100;
  do {
    for (pvVar3 = *ppvVar1; pvVar3 != (vocdef *)0x0; pvVar3 = pvVar3->vocnxt) {
      uVar4 = pvVar3->vocwlst;
      while( true ) {
        if (uVar4 == 0xffffffff) {
          pvVar5 = (vocwdef *)0x0;
        }
        else {
          pvVar5 = (vocwdef *)
                   ((long)&ctx->voccxwp[(ulong)uVar4 / 2000]->vocwnxt + (ulong)((uVar4 % 2000) * 8))
          ;
        }
        if (pvVar5 == (vocwdef *)0x0) break;
        if ((objn == 0xffff) || (pvVar5->vocwobj == objn)) {
          (*fn)(fnctx,pvVar3,pvVar5);
        }
        uVar4 = pvVar5->vocwnxt;
      }
    }
    ppvVar1 = ppvVar1 + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void voc_iterate(voccxdef *ctx, objnum objn,
                 void (*fn)(void *, vocdef *, vocwdef *), void *fnctx)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;
    uint      idx;

    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v ; v = v->vocnxt)
        {
            /* go through each object relation for this word */
            for (idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 idx = vw->vocwnxt, vw = vocwget(ctx, idx))
            {
                /*
                 *   if this word is for this object, call the callback
                 */
                if (objn == MCMONINV || vw->vocwobj == objn)
                    (*fn)(fnctx, v, vw);
            }
        }
    }
}